

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_write_vec3_double(void *a,double *vertices,uint32_t nr_of_vertices,trico_stream_type st)

{
  ssize_t sVar1;
  uint8_t *local_80;
  uint8_t *compressed_z;
  uint8_t *puStack_70;
  uint32_t nr_of_compressed_z_bytes;
  uint8_t *compressed_y;
  uint8_t *puStack_60;
  uint32_t nr_of_compressed_y_bytes;
  uint8_t *compressed_x;
  double *pdStack_50;
  uint32_t nr_of_compressed_x_bytes;
  double *z;
  double *y;
  double *x;
  void *pvStack_30;
  uint8_t header;
  trico_archive *arch;
  trico_stream_type st_local;
  uint32_t nr_of_vertices_local;
  double *vertices_local;
  void *a_local;
  
  x._7_1_ = (undefined1)st;
  pvStack_30 = a;
  arch._0_4_ = st;
  arch._4_4_ = nr_of_vertices;
  _st_local = vertices;
  vertices_local = (double *)a;
  sVar1 = write((int)&x + 7,(void *)0x1,1);
  if ((int)sVar1 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    sVar1 = write((int)&arch + 4,(void *)0x4,1);
    if ((int)sVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      y = (double *)trico_malloc((ulong)arch._4_4_ << 3);
      z = (double *)trico_malloc((ulong)arch._4_4_ << 3);
      pdStack_50 = (double *)trico_malloc((ulong)arch._4_4_ << 3);
      trico_transpose_xyz_aos_to_soa_double_precision
                (&y,&z,&stack0xffffffffffffffb0,_st_local,arch._4_4_);
      trico_compress_double_precision
                ((uint32_t *)((long)&compressed_x + 4),&stack0xffffffffffffffa0,y,arch._4_4_,0x14,
                 0x14);
      trico_free(y);
      sVar1 = write((int)&compressed_x + 4,(void *)0x4,1);
      if ((int)sVar1 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        sVar1 = write((int)puStack_60,(void *)0x1,(ulong)compressed_x._4_4_);
        if ((int)sVar1 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          trico_free(puStack_60);
          trico_compress_double_precision
                    ((uint32_t *)((long)&compressed_y + 4),&stack0xffffffffffffff90,z,arch._4_4_,
                     0x14,0x14);
          trico_free(z);
          sVar1 = write((int)&compressed_y + 4,(void *)0x4,1);
          if ((int)sVar1 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            sVar1 = write((int)puStack_70,(void *)0x1,(ulong)compressed_y._4_4_);
            if ((int)sVar1 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              trico_free(puStack_70);
              trico_compress_double_precision
                        ((uint32_t *)((long)&compressed_z + 4),&local_80,pdStack_50,arch._4_4_,0x14,
                         0x14);
              trico_free(pdStack_50);
              sVar1 = write((int)&compressed_z + 4,(void *)0x4,1);
              if ((int)sVar1 == 0) {
                a_local._4_4_ = 0;
              }
              else {
                sVar1 = write((int)local_80,(void *)0x1,(ulong)compressed_z._4_4_);
                if ((int)sVar1 == 0) {
                  a_local._4_4_ = 0;
                }
                else {
                  trico_free(local_80);
                  a_local._4_4_ = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int trico_write_vec3_double(void* a, const double* vertices, uint32_t nr_of_vertices, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)st;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_vertices, sizeof(uint32_t), 1, arch))
    return 0;

  double* x = (double*)trico_malloc(sizeof(double)*nr_of_vertices);
  double* y = (double*)trico_malloc(sizeof(double)*nr_of_vertices);
  double* z = (double*)trico_malloc(sizeof(double)*nr_of_vertices);
  trico_transpose_xyz_aos_to_soa_double_precision(&x, &y, &z, vertices, nr_of_vertices);

  uint32_t nr_of_compressed_x_bytes;
  uint8_t* compressed_x;
  trico_compress_double_precision(&nr_of_compressed_x_bytes, &compressed_x, x, nr_of_vertices, 20, 20);

  trico_free(x);
  if (!write(&nr_of_compressed_x_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_x, 1, nr_of_compressed_x_bytes, arch))
    return 0;
  trico_free(compressed_x);

  uint32_t nr_of_compressed_y_bytes;
  uint8_t* compressed_y;
  trico_compress_double_precision(&nr_of_compressed_y_bytes, &compressed_y, y, nr_of_vertices, 20, 20);

  trico_free(y);
  if (!write(&nr_of_compressed_y_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_y, 1, nr_of_compressed_y_bytes, arch))
    return 0;
  trico_free(compressed_y);

  uint32_t nr_of_compressed_z_bytes;
  uint8_t* compressed_z;
  trico_compress_double_precision(&nr_of_compressed_z_bytes, &compressed_z, z, nr_of_vertices, 20, 20);

  trico_free(z);
  if (!write(&nr_of_compressed_z_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_z, 1, nr_of_compressed_z_bytes, arch))
    return 0;
  trico_free(compressed_z);
  return 1;
  }